

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O3

void __thiscall QGraphicsView::setScene(QGraphicsView *this,QGraphicsScene *scene)

{
  QGraphicsViewPrivate *this_00;
  QRegionData *pQVar1;
  Data *pDVar2;
  bool bVar3;
  QObject *pQVar4;
  Data *pDVar5;
  uint uVar6;
  QObject *pQVar7;
  long in_FS_OFFSET;
  QRectF local_58;
  QObject local_30 [8];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsViewPrivate **)(this + 8);
  pDVar5 = (this_00->scene).wp.d;
  if ((pDVar5 == (Data *)0x0) || (*(int *)(pDVar5 + 4) == 0)) {
    pQVar4 = (QObject *)0x0;
  }
  else {
    pQVar4 = (this_00->scene).wp.value;
  }
  if (pQVar4 != &scene->super_QObject) {
    QWidget::update((this_00->super_QAbstractScrollAreaPrivate).viewport);
    this_00->field_0x301 = this_00->field_0x301 | 0x10;
    (this_00->dirtyBoundingRect).x1 = 0;
    (this_00->dirtyBoundingRect).y1 = 0;
    (this_00->dirtyBoundingRect).x2 = -1;
    (this_00->dirtyBoundingRect).y2 = -1;
    QRegion::QRegion((QRegion *)&local_58);
    pQVar1 = (this_00->dirtyRegion).d;
    (this_00->dirtyRegion).d = (QRegionData *)local_58.xp;
    local_58.xp = (qreal)pQVar1;
    QRegion::~QRegion((QRegion *)&local_58);
    pDVar5 = (this_00->scene).wp.d;
    if (((pDVar5 != (Data *)0x0) && (*(int *)(pDVar5 + 4) != 0)) &&
       (pQVar4 = (this_00->scene).wp.value, pQVar4 != (QObject *)0x0)) {
      pQVar7 = (QObject *)0x0;
      if (*(int *)(pDVar5 + 4) == 0) {
        pQVar4 = pQVar7;
      }
      QObject::disconnect(pQVar4,"2changed(QList<QRectF>)",(QObject *)this,
                          "1updateScene(QList<QRectF>)");
      pDVar5 = (this_00->scene).wp.d;
      if (pDVar5 != (Data *)0x0) {
        if (*(int *)(pDVar5 + 4) == 0) {
          pQVar7 = (QObject *)0x0;
        }
        else {
          pQVar7 = (this_00->scene).wp.value;
        }
      }
      QObject::disconnect(pQVar7,"2sceneRectChanged(QRectF)",(QObject *)this,
                          "1updateSceneRect(QRectF)");
      QGraphicsScenePrivate::removeView
                (*(QGraphicsScenePrivate **)((this_00->scene).wp.value + 8),(QGraphicsView *)this);
      this_00->field_0x300 = this_00->field_0x300 & 0xfb;
      bVar3 = QWidget::isActiveWindow((QWidget *)this);
      if ((bVar3) && ((*(byte *)(*(long *)(this + 0x20) + 9) & 0x80) != 0)) {
        local_58.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
        local_58.yp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
        QEvent::QEvent((QEvent *)&local_58,WindowDeactivate);
        pDVar5 = (this_00->scene).wp.d;
        if ((pDVar5 == (Data *)0x0) || (*(int *)(pDVar5 + 4) == 0)) {
          pQVar4 = (QObject *)0x0;
        }
        else {
          pQVar4 = (this_00->scene).wp.value;
        }
        QCoreApplication::sendEvent(pQVar4,(QEvent *)&local_58);
        QEvent::~QEvent((QEvent *)&local_58);
      }
      bVar3 = QWidget::hasFocus((QWidget *)this);
      if (bVar3) {
        QGraphicsScene::clearFocus((QGraphicsScene *)(this_00->scene).wp.value);
      }
    }
    if (scene == (QGraphicsScene *)0x0) {
      pDVar5 = (Data *)0x0;
    }
    else {
      pDVar5 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(&scene->super_QObject);
    }
    pDVar2 = (this_00->scene).wp.d;
    (this_00->scene).wp.d = pDVar5;
    (this_00->scene).wp.value = &scene->super_QObject;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      *(int *)pDVar2 = *(int *)pDVar2 + -1;
      UNLOCK();
      if (*(int *)pDVar2 == 0) {
        operator_delete(pDVar2);
      }
      pDVar5 = (this_00->scene).wp.d;
    }
    if (((pDVar5 == (Data *)0x0) || (*(int *)(pDVar5 + 4) == 0)) ||
       (pQVar4 = (this_00->scene).wp.value, pQVar4 == (QObject *)0x0)) {
      QGraphicsViewPrivate::recalculateContentSize(this_00);
    }
    else {
      if (*(int *)(pDVar5 + 4) == 0) {
        pQVar4 = (QObject *)0x0;
      }
      QObject::connect(local_30,(char *)pQVar4,(QObject *)"2sceneRectChanged(QRectF)",(char *)this,
                       0x6f4aba);
      QMetaObject::Connection::~Connection((Connection *)local_30);
      this_00->updateSceneSlotReimplementedChecked = false;
      QGraphicsScenePrivate::addView
                (*(QGraphicsScenePrivate **)((this_00->scene).wp.value + 8),(QGraphicsView *)this);
      QGraphicsViewPrivate::recalculateContentSize(this_00);
      sceneRect(&local_58,this);
      (this_00->lastCenterPoint).xp = local_58.w * 0.5 + local_58.xp;
      (this_00->lastCenterPoint).yp = local_58.h * 0.5 + local_58.yp;
      this_00->field_0x300 = this_00->field_0x300 | 0x80;
      if ((((this_00->scene).wp.d == (Data *)0x0) ||
          (uVar6 = *(uint *)(*(long *)((this_00->scene).wp.value + 8) + 0xb8),
          (uVar6 >> 0xc & 1) == 0)) || ((uVar6 >> 0xd & 1) == 0)) {
        QWidget::setAttribute
                  ((this_00->super_QAbstractScrollAreaPrivate).viewport,WA_MouseTracking,true);
        uVar6 = *(uint *)(*(long *)((this_00->scene).wp.value + 8) + 0xb8);
      }
      if ((uVar6 >> 0x10 & 1) == 0) {
        QWidget::setAttribute
                  ((this_00->super_QAbstractScrollAreaPrivate).viewport,WA_AcceptTouchEvents,true);
      }
      bVar3 = QWidget::isActiveWindow((QWidget *)this);
      if ((bVar3) && ((*(byte *)(*(long *)(this + 0x20) + 9) & 0x80) != 0)) {
        local_58.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
        local_58.yp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
        QEvent::QEvent((QEvent *)&local_58,WindowActivate);
        pDVar5 = (this_00->scene).wp.d;
        if ((pDVar5 == (Data *)0x0) || (*(int *)(pDVar5 + 4) == 0)) {
          pQVar4 = (QObject *)0x0;
        }
        else {
          pQVar4 = (this_00->scene).wp.value;
        }
        QCoreApplication::sendEvent(pQVar4,(QEvent *)&local_58);
        QEvent::~QEvent((QEvent *)&local_58);
      }
    }
    QGraphicsViewPrivate::updateInputMethodSensitivity(this_00);
    pDVar5 = (this_00->scene).wp.d;
    if (((pDVar5 != (Data *)0x0) && (*(int *)(pDVar5 + 4) != 0)) &&
       ((this_00->scene).wp.value != (QObject *)0x0)) {
      bVar3 = QWidget::hasFocus((QWidget *)this);
      if (bVar3) {
        QGraphicsScene::setFocus((QGraphicsScene *)(this_00->scene).wp.value,OtherFocusReason);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsView::setScene(QGraphicsScene *scene)
{
    Q_D(QGraphicsView);
    if (d->scene == scene)
        return;

    // Always update the viewport when the scene changes.
    d->updateAll();

    // Remove the previously assigned scene.
    if (d->scene) {
        disconnect(d->scene, SIGNAL(changed(QList<QRectF>)),
                   this, SLOT(updateScene(QList<QRectF>)));
        disconnect(d->scene, SIGNAL(sceneRectChanged(QRectF)),
                   this, SLOT(updateSceneRect(QRectF)));
        d->scene->d_func()->removeView(this);
        d->connectedToScene = false;

        if (isActiveWindow() && isVisible()) {
            QEvent windowDeactivate(QEvent::WindowDeactivate);
            QCoreApplication::sendEvent(d->scene, &windowDeactivate);
        }
        if (hasFocus())
            d->scene->clearFocus();
    }

    // Assign the new scene and update the contents (scrollbars, etc.)).
    if ((d->scene = scene)) {
        connect(d->scene, SIGNAL(sceneRectChanged(QRectF)),
                this, SLOT(updateSceneRect(QRectF)));
        d->updateSceneSlotReimplementedChecked = false;
        d->scene->d_func()->addView(this);
        d->recalculateContentSize();
        d->lastCenterPoint = sceneRect().center();
        d->keepLastCenterPoint = true;
        // We are only interested in mouse tracking if items accept
        // hover events or use non-default cursors.
        if (!d->scene->d_func()->allItemsIgnoreHoverEvents
            || !d->scene->d_func()->allItemsUseDefaultCursor) {
            d->viewport->setMouseTracking(true);
        }

        // enable touch events if any items is interested in them
        if (!d->scene->d_func()->allItemsIgnoreTouchEvents)
            d->viewport->setAttribute(Qt::WA_AcceptTouchEvents);

        if (isActiveWindow() && isVisible()) {
            QEvent windowActivate(QEvent::WindowActivate);
            QCoreApplication::sendEvent(d->scene, &windowActivate);
        }
    } else {
        d->recalculateContentSize();
    }

    d->updateInputMethodSensitivity();

    if (d->scene && hasFocus())
        d->scene->setFocus();
}